

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputPFBDecodeStream.cpp
# Opt level: O1

void __thiscall InputPFBDecodeStream::SkipTillToken(InputPFBDecodeStream *this)

{
  Byte *pBVar1;
  int iVar2;
  EStatusCode EVar3;
  ulong uVar4;
  Byte buffer;
  Byte local_19;
  
  local_19 = '\0';
  if ((this->mInternalState == eSuccess) &&
     (iVar2 = (*(this->super_IByteReader)._vptr_IByteReader[3])(), (char)iVar2 != '\0')) {
    do {
      if (this->mHasTokenBuffer == false) {
        if (this->mSegmentSize <= this->mInSegmentReadIndex) {
          return;
        }
        iVar2 = (*this->mStreamToDecode->_vptr_IByteReader[3])();
        if ((char)iVar2 == '\0') {
          return;
        }
      }
      if (this->mHasTokenBuffer == true) {
        local_19 = this->mTokenBuffer;
        this->mHasTokenBuffer = false;
      }
      else {
        EVar3 = (*this->mDecodeMethod)(this,&local_19);
        if (EVar3 != eSuccess) {
          return;
        }
      }
      uVar4 = 0;
      do {
        pBVar1 = "" + uVar4;
        if (4 < uVar4) break;
        uVar4 = uVar4 + 1;
      } while (*pBVar1 != local_19);
    } while (*pBVar1 == local_19);
    this->mHasTokenBuffer = true;
    this->mTokenBuffer = local_19;
  }
  return;
}

Assistant:

void InputPFBDecodeStream::SkipTillToken()
{
	Byte buffer = 0;

	if(mInternalState != PDFHummus::eSuccess || !NotEnded())
		return;

	// skip till hitting first non space, or segment end
	while(IsSegmentNotEnded())
	{
		if(GetNextByteForToken(buffer) != PDFHummus::eSuccess)
			break;

		if(!IsPostScriptWhiteSpace(buffer))
		{
			SaveTokenBuffer(buffer);
			break;
		}
	}
}